

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::add_implied_read_expression
          (Compiler *this,SPIRAccessChain *e,uint32_t source)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  TypedID<(spirv_cross::Types)0> local_30;
  TypedID<(spirv_cross::Types)0> local_2c;
  TypedID<(spirv_cross::Types)0> *local_28;
  TypedID<(spirv_cross::Types)0> *itr;
  SPIRAccessChain *pSStack_18;
  uint32_t source_local;
  SPIRAccessChain *e_local;
  Compiler *this_local;
  
  itr._4_4_ = source;
  pSStack_18 = e;
  e_local = (SPIRAccessChain *)this;
  pTVar1 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (&e->implied_read_expressions);
  pTVar2 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (&pSStack_18->implied_read_expressions);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,itr._4_4_);
  pTVar1 = ::std::
           find<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                     (pTVar1,pTVar2,&local_2c);
  local_28 = pTVar1;
  pTVar2 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (&pSStack_18->implied_read_expressions);
  if (pTVar1 == pTVar2) {
    this_00 = &pSStack_18->implied_read_expressions;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_30,itr._4_4_);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back(this_00,&local_30);
  }
  return;
}

Assistant:

void Compiler::add_implied_read_expression(SPIRAccessChain &e, uint32_t source)
{
	auto itr = find(begin(e.implied_read_expressions), end(e.implied_read_expressions), ID(source));
	if (itr == end(e.implied_read_expressions))
		e.implied_read_expressions.push_back(source);
}